

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O2

SpatialForceVector * __thiscall
iDynTree::SpatialInertia::multiply
          (SpatialForceVector *__return_storage_ptr__,SpatialInertia *this,SpatialMotionVector *op)

{
  double dVar1;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> angularMotion;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> linearMotion;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> mcom;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> angularForce;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> linearForce;
  AngularVector3T *local_c8;
  undefined2 local_c0;
  SpatialMotionVector *local_b8 [2];
  double *local_a8 [2];
  AngularVector3T *local_98 [2];
  SpatialVector<iDynTree::SpatialForceVector> *local_88 [2];
  type local_78;
  undefined1 local_60 [24];
  scalar_constant_op<double> local_48;
  SpatialMotionVector *local_40;
  type *local_28;
  
  local_88[0] = &__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = 0.0;
  __return_storage_ptr__->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_00237ca8
  ;
  local_98[0] = &(__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).
                 angularVec3;
  local_c8 = &(op->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3;
  local_a8[0] = this->m_mcom;
  dVar1 = this->m_mass;
  local_b8[0] = op;
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_78,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>> *)
             local_a8,(MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)&local_c8);
  local_48.m_other = dVar1;
  local_40 = op;
  local_28 = &local_78;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_88,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_60);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_78,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>> *)
             local_a8,(MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)local_b8);
  local_60._8_8_ = &this->m_rotInertia;
  local_48.m_other = (double)local_c8;
  local_40 = (SpatialMotionVector *)CONCAT62(local_40._2_6_,local_c0);
  local_60._0_8_ = &local_78;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>const>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_98,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)local_60);
  return __return_storage_ptr__;
}

Assistant:

SpatialForceVector SpatialInertia::multiply(const SpatialMotionVector& op) const
{
    SpatialForceVector ret;

    // we call this linearForce and angularForce
    // but please remember that they can also be
    // linear and angular momentum
    Eigen::Map<Eigen::Vector3d> linearForce(ret.getLinearVec3().data());
    Eigen::Map<Eigen::Vector3d> angularForce(ret.getAngularVec3().data());
    Eigen::Map<const Eigen::Vector3d> linearMotion(op.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angularMotion(op.getAngularVec3().data());

    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);
    Eigen::Map<const Eigen::Matrix3d> inertia3d(this->m_rotInertia.data());

    // Implementing the 2.63 formula in Featherstone 2008
    linearForce  = this->m_mass*linearMotion - mcom.cross(angularMotion);
    angularForce = mcom.cross(linearMotion) + inertia3d*(angularMotion);

    return ret;
}